

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_copy_propagation_elements.cpp
# Opt level: O2

bool do_copy_propagation_elements(exec_list *instructions)

{
  bool bVar1;
  void *mem_ctx;
  ir_copy_propagation_elements_visitor v;
  
  ir_rvalue_visitor::ir_rvalue_visitor(&v.super_ir_rvalue_visitor);
  v.super_ir_rvalue_visitor.super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.
  _vptr_ir_hierarchical_visitor = (_func_int **)&PTR_visit_00252678;
  v.progress = false;
  v.killed_all = false;
  v.mem_ctx = ralloc_context((void *)0x0);
  v.lin_ctx = linear_alloc_parent(v.mem_ctx,0);
  v.shader_mem_ctx = (void *)0x0;
  mem_ctx = v.mem_ctx;
  v.kills = (exec_list *)exec_list::operator_new(0x20,v.mem_ctx);
  ((v.kills)->head_sentinel).next = &(v.kills)->tail_sentinel;
  ((v.kills)->head_sentinel).prev = (exec_node *)0x0;
  ((v.kills)->tail_sentinel).next = (exec_node *)0x0;
  ((v.kills)->tail_sentinel).prev = (exec_node *)v.kills;
  v.state = anon_unknown.dwarf_8deca::copy_propagation_state::create
                      ((copy_propagation_state *)v.mem_ctx,mem_ctx);
  visit_list_elements((ir_hierarchical_visitor *)&v,instructions,true);
  bVar1 = v.progress;
  anon_unknown.dwarf_8deca::ir_copy_propagation_elements_visitor::
  ~ir_copy_propagation_elements_visitor(&v);
  return bVar1;
}

Assistant:

bool
do_copy_propagation_elements(exec_list *instructions)
{
   ir_copy_propagation_elements_visitor v;

   visit_list_elements(&v, instructions);

   return v.progress;
}